

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

int luv_udp_set_broadcast(lua_State *L)

{
  int on;
  uint status;
  uv_udp_t *handle;
  int iVar1;
  int in_ESI;
  
  handle = luv_check_udp(L,in_ESI);
  iVar1 = 1;
  luaL_checktype(L,2,1);
  on = lua_toboolean(L,2);
  status = uv_udp_set_broadcast(handle,on);
  if ((int)status < 0) {
    luv_error(L,status);
    iVar1 = 3;
  }
  else {
    lua_pushinteger(L,(ulong)status);
  }
  return iVar1;
}

Assistant:

static int luv_udp_set_broadcast(lua_State* L) {
  uv_udp_t* handle = luv_check_udp(L, 1);
  int on, ret;
  luaL_checktype(L, 2, LUA_TBOOLEAN);
  on = lua_toboolean(L, 2);
  ret =uv_udp_set_broadcast(handle, on);
  return luv_result(L, ret);
}